

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleStringsCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  undefined3 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  BOM BVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  undefined7 uVar16;
  undefined8 uVar13;
  ulong uVar14;
  ostream *poVar15;
  uint uVar17;
  pointer pbVar18;
  uint uVar19;
  char *pcVar20;
  char cVar21;
  undefined1 uVar22;
  uint uVar23;
  char *unaff_R13;
  int limit_output;
  string output;
  int limit_input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  string fileName;
  string outVar;
  string s;
  ifstream fin;
  RegularExpression regex;
  BOM local_54c;
  uint local_53c;
  int local_538;
  uint local_534;
  string local_530;
  undefined8 local_510;
  uint local_508;
  int local_504;
  ulong local_500;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4f8;
  uint local_4d8;
  int local_4d4;
  long *local_4d0;
  char *local_4c8;
  long local_4c0 [2];
  ulong local_4b0;
  string local_4a8;
  undefined1 local_488 [8];
  char *local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478 [6];
  ios_base local_418 [264];
  char *local_310;
  undefined1 local_308 [32];
  uint auStack_2e8 [20];
  ios_base local_298 [408];
  RegularExpression local_100;
  
  pbVar18 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar18) < 0x41) {
    local_308._0_8_ = local_308 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_308,"STRINGS requires a file name and output variable","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_308);
    if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
      operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
    }
    uVar22 = 0;
  }
  else {
    local_4d0 = local_4c0;
    pcVar1 = pbVar18[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4d0,pcVar1,pcVar1 + pbVar18[1]._M_string_length);
    bVar4 = cmsys::SystemTools::FileIsFullPath((char *)local_4d0);
    if (!bVar4) {
      pcVar11 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      unaff_R13 = local_4c8;
      strlen(pcVar11);
      std::__cxx11::string::_M_replace((ulong)&local_4d0,0,unaff_R13,(ulong)pcVar11);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                     "/",(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1);
      std::__cxx11::string::_M_append((char *)&local_4d0,local_308._0_8_);
      if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
        operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
      }
    }
    pbVar18 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
    pcVar1 = pbVar18[2]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4a8,pcVar1,pcVar1 + pbVar18[2]._M_string_length);
    local_504 = -1;
    local_538 = -1;
    local_100.program = (char *)0x0;
    pbVar18 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar12 = (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar18;
    bVar4 = 0x60 < uVar12;
    uVar16 = (undefined7)(uVar12 >> 8);
    if (bVar4) {
      local_500 = CONCAT44(local_500._4_4_,(int)CONCAT71(uVar16,1));
      uVar12 = 3;
      uVar19 = 4;
      local_54c = BOM_None;
      local_508 = 0;
      bVar3 = false;
      local_53c = 0;
      local_534 = 0;
      local_510 = (char *)((ulong)local_510._4_4_ << 0x20);
      pcVar11 = (char *)0x0;
LAB_002d3e5e:
      iVar6 = std::__cxx11::string::compare((char *)(pbVar18 + uVar12));
      if (iVar6 == 0) {
        pcVar20 = (char *)0x1;
        goto LAB_002d43d7;
      }
      iVar6 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar6 == 0) {
        pcVar20 = (char *)0x2;
        goto LAB_002d43d7;
      }
      iVar6 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar6 == 0) {
        pcVar20 = (char *)0x3;
        goto LAB_002d43d7;
      }
      iVar6 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar6 == 0) {
        pcVar20 = (char *)0x4;
        goto LAB_002d43d7;
      }
      iVar6 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar6 == 0) {
        pcVar20 = (char *)0x5;
        goto LAB_002d43d7;
      }
      iVar6 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar6 == 0) {
        pcVar20 = (char *)0x7;
        goto LAB_002d43d7;
      }
      uVar13 = std::__cxx11::string::compare
                         ((char *)((args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if ((int)uVar13 == 0) {
        local_508 = (uint)CONCAT71((int7)((ulong)uVar13 >> 8),1);
        pcVar20 = (char *)0x0;
        goto LAB_002d43d7;
      }
      iVar6 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      pcVar20 = (char *)0x0;
      if (iVar6 == 0) {
        local_500 = local_500 & 0xffffffff00000000;
        pcVar20 = (char *)0x0;
        goto LAB_002d43d7;
      }
      iVar6 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar6 == 0) {
        pcVar20 = (char *)0x8;
        goto LAB_002d43d7;
      }
      uVar23 = (int)pcVar11 - 1;
      uVar2 = (undefined3)(uVar23 >> 8);
      uVar9 = local_53c;
      switch((char *)(ulong)uVar23) {
      case (char *)0x0:
        pcVar20 = (char *)0x0;
        iVar6 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p,
                                "%d",&local_504);
        if ((iVar6 == 1) && (-1 < local_504)) goto LAB_002d43d7;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_308,"STRINGS option LIMIT_INPUT value \"",0x22);
        pbVar18 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,pbVar18[uVar12]._M_dataplus._M_p,
                             pbVar18[uVar12]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15,"\" is not an unsigned integer.",0x1d);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_488);
        break;
      case (char *)0x1:
        pcVar20 = (char *)0x0;
        iVar6 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p,
                                "%d",&local_538);
        if ((iVar6 == 1) && (-1 < local_538)) goto LAB_002d43d7;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_308,"STRINGS option LIMIT_OUTPUT value \"",0x23);
        pbVar18 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,pbVar18[uVar12]._M_dataplus._M_p,
                             pbVar18[uVar12]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15,"\" is not an unsigned integer.",0x1d);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_488);
        break;
      case (char *)0x2:
        pcVar20 = (char *)0x0;
        iVar6 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p,
                                "%d",&local_530);
        unaff_R13 = (char *)(ulong)CONCAT31(uVar2,-1 < (int)(uint)local_530._M_dataplus._M_p &&
                                                  iVar6 == 1);
        uVar9 = (uint)local_530._M_dataplus._M_p;
        uVar23 = local_534;
        if (-1 >= (int)(uint)local_530._M_dataplus._M_p || iVar6 != 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_308,"STRINGS option LIMIT_COUNT value \"",0x22);
          pbVar18 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_308,pbVar18[uVar12]._M_dataplus._M_p,
                               pbVar18[uVar12]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"\" is not an unsigned integer.",0x1d);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)local_488);
          if (local_488 != (undefined1  [8])local_478) {
            operator_delete((void *)local_488,
                            CONCAT71(local_478[0]._M_allocated_capacity._1_7_,
                                     local_478[0]._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
          std::ios_base::~ios_base(local_298);
          pcVar20 = (char *)0x3;
          uVar9 = local_53c;
          uVar23 = local_534;
        }
        goto LAB_002d43ce;
      case (char *)0x3:
        pcVar20 = (char *)0x0;
        iVar7 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p,
                                "%d",&local_530);
        unaff_R13 = (char *)(ulong)CONCAT31(uVar2,-1 < (int)(uint)local_530._M_dataplus._M_p &&
                                                  iVar7 == 1);
        iVar6 = (uint)local_530._M_dataplus._M_p;
        if (-1 >= (int)(uint)local_530._M_dataplus._M_p || iVar7 != 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_308,"STRINGS option LENGTH_MINIMUM value \"",0x25);
          pbVar18 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_308,pbVar18[uVar12]._M_dataplus._M_p,
                               pbVar18[uVar12]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"\" is not an unsigned integer.",0x1d);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)local_488);
          if (local_488 != (undefined1  [8])local_478) {
            operator_delete((void *)local_488,
                            CONCAT71(local_478[0]._M_allocated_capacity._1_7_,
                                     local_478[0]._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
          std::ios_base::~ios_base(local_298);
          pcVar20 = (char *)0x4;
          iVar6 = (int)local_510;
        }
        local_510 = (char *)CONCAT44(local_510._4_4_,iVar6);
        uVar23 = local_534;
        goto LAB_002d43ce;
      case (char *)0x4:
        pcVar20 = (char *)0x0;
        iVar6 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p,
                                "%d",&local_530);
        unaff_R13 = (char *)(ulong)CONCAT31(uVar2,-1 < (int)(uint)local_530._M_dataplus._M_p &&
                                                  iVar6 == 1);
        uVar23 = (uint)local_530._M_dataplus._M_p;
        if (-1 >= (int)(uint)local_530._M_dataplus._M_p || iVar6 != 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_308,"STRINGS option LENGTH_MAXIMUM value \"",0x25);
          pbVar18 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_308,pbVar18[uVar12]._M_dataplus._M_p,
                               pbVar18[uVar12]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"\" is not an unsigned integer.",0x1d);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)local_488);
          if (local_488 != (undefined1  [8])local_478) {
            operator_delete((void *)local_488,
                            CONCAT71(local_478[0]._M_allocated_capacity._1_7_,
                                     local_478[0]._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
          std::ios_base::~ios_base(local_298);
          pcVar20 = (char *)0x5;
          uVar23 = local_534;
        }
LAB_002d43ce:
        local_534 = uVar23;
        local_53c = uVar9;
        if ((char)unaff_R13 != '\0') goto LAB_002d43d7;
        goto LAB_002d445a;
      default:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_308,"STRINGS given unknown argument \"",0x20);
        pbVar18 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,pbVar18[uVar12]._M_dataplus._M_p,
                             pbVar18[uVar12]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\"",1);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_488);
        break;
      case (char *)0x6:
        bVar5 = cmsys::RegularExpression::compile
                          (&local_100,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p);
        if (bVar5) {
          bVar3 = true;
          goto LAB_002d43d7;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_308,"STRINGS option REGEX value \"",0x1c);
        pbVar18 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,pbVar18[uVar12]._M_dataplus._M_p,
                             pbVar18[uVar12]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\" could not be compiled.",0x18)
        ;
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_488);
        break;
      case (char *)0x7:
        iVar6 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar6 == 0) {
          local_54c = BOM_UTF8;
        }
        else {
          iVar6 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar12));
          if (iVar6 == 0) {
            local_54c = BOM_UTF16LE;
          }
          else {
            iVar6 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar12));
            if (iVar6 == 0) {
              local_54c = BOM_UTF16BE;
            }
            else {
              iVar6 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar12));
              if (iVar6 == 0) {
                local_54c = BOM_UTF32LE;
              }
              else {
                iVar6 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar12));
                if (iVar6 != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,"STRINGS option ENCODING \"",0x19);
                  pbVar18 = (args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_308,pbVar18[uVar12]._M_dataplus._M_p,
                                       pbVar18[uVar12]._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,"\" not recognized.",0x11);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_488);
                  break;
                }
                local_54c = BOM_UTF32BE;
                pcVar20 = (char *)0x0;
              }
            }
          }
        }
        goto LAB_002d43d7;
      }
      if (local_488 != (undefined1  [8])local_478) {
        operator_delete((void *)local_488,
                        CONCAT71(local_478[0]._M_allocated_capacity._1_7_,
                                 local_478[0]._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
      std::ios_base::~ios_base(local_298);
      unaff_R13 = (char *)(ulong)uVar23;
      goto LAB_002d445a;
    }
    bVar3 = false;
    local_500 = CONCAT44(local_500._4_4_,(int)CONCAT71(uVar16,1));
    local_508 = 0;
    local_54c = BOM_None;
    local_510 = (char *)((ulong)local_510._4_4_ << 0x20);
    local_534 = 0;
    local_53c = 0;
LAB_002d445a:
    if (bVar4) {
      uVar22 = 0;
    }
    else {
      if ((local_500 & 1) != 0) {
        pcVar11 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
        std::__cxx11::string::string((string *)local_308,pcVar11,(allocator *)local_488);
        std::__cxx11::string::append(local_308);
        std::__cxx11::string::append(local_308);
        bVar4 = cmHexFileConverter::TryConvert((char *)local_4d0,(char *)local_308._0_8_);
        if (bVar4) {
          std::__cxx11::string::_M_assign((string *)&local_4d0);
        }
        if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
          operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
        }
      }
      std::ifstream::ifstream(local_308,(char *)local_4d0,_S_in);
      bVar4 = (*(byte *)((long)auStack_2e8 + *(long *)(local_308._0_8_ + -0x18)) & 5) == 0;
      uVar12 = CONCAT71((int7)((ulong)unaff_R13 >> 8),bVar4);
      if (bVar4) {
        local_4d8 = (uint)uVar12;
        BVar8 = cmsys::FStream::ReadBOM((istream *)local_308);
        if (BVar8 == BOM_None) {
          BVar8 = local_54c;
        }
        if (local_54c != BOM_None) {
          BVar8 = local_54c;
        }
        uVar19 = 3;
        if ((BVar8 & ~BOM_UTF8) != BOM_UTF32BE) {
          uVar19 = (uint)((BVar8 & ~BOM_UTF8) == BOM_UTF16BE);
        }
        local_4f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_4f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_4f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_488 = (undefined1  [8])local_478;
        local_480 = (char *)0x0;
        local_478[0]._M_local_buf[0] = '\0';
        local_4b0 = (ulong)local_53c;
        local_510 = (char *)((ulong)local_510 & 0xffffffff);
        local_310 = (char *)(ulong)local_534;
        uVar12 = 0;
        do {
          if ((((local_53c != 0) &&
               (local_4b0 <=
                (ulong)((long)local_4f8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_4f8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5))) ||
              ((-1 < local_504 && (iVar6 = std::istream::tellg(), local_504 <= iVar6)))) ||
             ((*(byte *)((long)auStack_2e8 + *(long *)(local_308._0_8_ + -0x18)) & 5) != 0)) break;
          local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
          local_530._M_string_length = 0;
          local_530.field_2._M_local_buf[0] = '\0';
          uVar9 = std::istream::get();
          cVar21 = (char)local_308;
          local_500 = uVar12;
          if (uVar19 != 0) {
            uVar23 = 1;
            do {
              uVar10 = std::istream::get();
              uVar17 = *(uint *)((long)auStack_2e8 + *(long *)(local_308._0_8_ + -0x18));
              if ((uVar17 & 5) == 0) {
                uVar9 = uVar9 << 8 | uVar10;
              }
              else {
                std::istream::putback(cVar21);
              }
            } while (((uVar17 & 5) == 0) && (bVar4 = uVar23 < uVar19, uVar23 = uVar23 + 1, bVar4));
          }
          uVar12 = local_500;
          if (BVar8 == BOM_UTF32LE) {
            uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
          }
          else if (BVar8 == BOM_UTF16LE) {
            uVar9 = (uint)(ushort)((ushort)uVar9 << 8 | (ushort)uVar9 >> 8);
          }
          if (uVar9 == 0xd) {
LAB_002d4a81:
            bVar4 = false;
          }
          else {
            iVar6 = isprint(uVar9);
            if ((iVar6 == 0) &&
               ((byte)(uVar9 == 10 & (byte)local_508 | (uVar9 == 9 || uVar9 - 0x20 < 0x5f)) != 1)) {
              if (BVar8 == BOM_UTF8) {
                uVar12 = 0;
                do {
                  uVar23 = HandleStringsCommand::utf8_check_table[uVar12][0] & uVar9;
                  uVar14 = uVar12 + 1;
                  uVar17 = (uint)HandleStringsCommand::utf8_check_table[uVar12][1];
                  if (uVar23 == uVar17) break;
                  bVar4 = uVar12 < 2;
                  uVar12 = uVar14;
                } while (bVar4);
                uVar10 = (int)uVar14 + 1;
                if (uVar23 != uVar17) {
                  uVar10 = 0;
                }
                if (uVar23 == uVar17) {
                  local_4d4 = uVar10 + (uVar10 == 0);
                  iVar6 = 0;
                  do {
                    if ((iVar6 != 0) &&
                       ((uVar9 = std::istream::get(), (uVar9 & 0xc0) != 0x80 ||
                        ((*(uint *)((long)auStack_2e8 + *(long *)(local_308._0_8_ + -0x18)) & 5) !=
                         0)))) {
                      std::istream::putback(cVar21);
                      break;
                    }
                    std::__cxx11::string::push_back((char)&local_530);
                    iVar6 = iVar6 + 1;
                  } while (local_4d4 != iVar6);
                }
                uVar12 = local_500;
                if ((char *)local_530._M_string_length != (char *)(ulong)uVar10) {
                  if ((char *)local_530._M_string_length != (char *)0x1) {
                    pcVar11 = (char *)0x0;
                    pcVar20 = (char *)0x1;
                    do {
                      uVar9 = (uint)((char *)(local_530._M_string_length +
                                             (long)local_530._M_dataplus._M_p))[~(ulong)pcVar11];
                      std::istream::putback(cVar21);
                      bVar4 = pcVar20 < (char *)(local_530._M_string_length + -1);
                      pcVar11 = pcVar20;
                      pcVar20 = (char *)(ulong)((int)pcVar20 + 1);
                    } while (bVar4);
                  }
                  std::__cxx11::string::_M_replace
                            ((ulong)&local_530,0,(char *)local_530._M_string_length,0x512e03);
                }
              }
            }
            else {
              std::__cxx11::string::push_back((char)&local_530);
            }
            if (uVar9 == 10 && (local_508 & 1) == 0) {
              if ((local_480 < local_510) ||
                 ((bVar3 && (bVar4 = cmsys::RegularExpression::find(&local_100,(char *)local_488),
                            !bVar4)))) {
LAB_002d49ba:
                std::__cxx11::string::_M_replace((ulong)local_488,0,local_480,0x512e03);
                goto LAB_002d4a08;
              }
              uVar9 = (int)uVar12 + (int)local_480 + 1;
              uVar12 = (ulong)uVar9;
              if ((local_538 < 0) || ((int)uVar9 < local_538)) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_4f8,(value_type *)local_488);
                goto LAB_002d49ba;
              }
              bVar4 = true;
              std::__cxx11::string::_M_replace((ulong)local_488,0,local_480,0x512e03);
            }
            else {
              if ((char *)local_530._M_string_length == (char *)0x0) {
                if ((local_480 != (char *)0x0 && local_510 <= local_480) &&
                   ((!bVar3 ||
                    (bVar4 = cmsys::RegularExpression::find(&local_100,(char *)local_488), bVar4))))
                {
                  uVar9 = (int)uVar12 + (int)local_480 + 1;
                  uVar12 = (ulong)uVar9;
                  if ((-1 < local_538) && (local_538 <= (int)uVar9)) {
                    bVar4 = true;
                    std::__cxx11::string::_M_replace((ulong)local_488,0,local_480,0x512e03);
                    goto LAB_002d4a84;
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&local_4f8,(value_type *)local_488);
                }
                std::__cxx11::string::_M_replace((ulong)local_488,0,local_480,0x512e03);
              }
              else {
                std::__cxx11::string::_M_append(local_488,(ulong)local_530._M_dataplus._M_p);
              }
LAB_002d4a08:
              if ((local_534 == 0) || (local_480 != local_310)) goto LAB_002d4a81;
              if ((local_510 <= local_480) &&
                 ((!bVar3 ||
                  (bVar4 = cmsys::RegularExpression::find(&local_100,(char *)local_488), bVar4)))) {
                uVar9 = (int)uVar12 + (int)local_480 + 1;
                uVar12 = (ulong)uVar9;
                if ((-1 < local_538) && (local_538 <= (int)uVar9)) {
                  bVar4 = true;
                  std::__cxx11::string::_M_replace((ulong)local_488,0,local_480,0x512e03);
                  goto LAB_002d4a84;
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_4f8,(value_type *)local_488);
              }
              bVar4 = false;
              std::__cxx11::string::_M_replace((ulong)local_488,0,local_480,0x512e03);
            }
          }
LAB_002d4a84:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_530._M_dataplus._M_p != &local_530.field_2) {
            operator_delete(local_530._M_dataplus._M_p,
                            CONCAT71(local_530.field_2._M_allocated_capacity._1_7_,
                                     local_530.field_2._M_local_buf[0]) + 1);
          }
        } while (!bVar4);
        if (((((local_53c == 0) ||
              ((ulong)((long)local_4f8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_4f8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5) < local_4b0)) &&
             (local_480 != (char *)0x0)) &&
            ((local_510 <= local_480 &&
             ((!bVar3 ||
              (bVar4 = cmsys::RegularExpression::find(&local_100,(char *)local_488), bVar4)))))) &&
           ((local_538 < 0 || ((int)local_480 + (int)uVar12 + 1 < local_538)))) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_4f8,(value_type *)local_488);
        }
        local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
        local_530._M_string_length = 0;
        local_530.field_2._M_local_buf[0] = '\0';
        uVar12 = (ulong)local_4d8;
        if (local_4f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_4f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pbVar18 = local_4f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            std::__cxx11::string::append((char *)&local_530);
            if (pbVar18->_M_string_length != 0) {
              uVar19 = 1;
              uVar14 = 0;
              do {
                cVar21 = (char)&local_530;
                if ((pbVar18->_M_dataplus)._M_p[uVar14] == ';') {
                  std::__cxx11::string::push_back(cVar21);
                }
                std::__cxx11::string::push_back(cVar21);
                uVar14 = (ulong)uVar19;
                uVar19 = uVar19 + 1;
              } while (uVar14 < pbVar18->_M_string_length);
            }
            pbVar18 = pbVar18 + 1;
          } while (pbVar18 !=
                   local_4f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        cmMakefile::AddDefinition
                  ((this->super_cmCommand).Makefile,&local_4a8,local_530._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._M_dataplus._M_p != &local_530.field_2) {
          operator_delete(local_530._M_dataplus._M_p,
                          CONCAT71(local_530.field_2._M_allocated_capacity._1_7_,
                                   local_530.field_2._M_local_buf[0]) + 1);
        }
        if (local_488 != (undefined1  [8])local_478) {
          operator_delete((void *)local_488,
                          CONCAT71(local_478[0]._M_allocated_capacity._1_7_,
                                   local_478[0]._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_4f8);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_488,"STRINGS file \"",0xe);
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_488,(char *)local_4d0,(long)local_4c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\" cannot be read.",0x11);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_530);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._M_dataplus._M_p != &local_530.field_2) {
          operator_delete(local_530._M_dataplus._M_p,
                          CONCAT71(local_530.field_2._M_allocated_capacity._1_7_,
                                   local_530.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
        std::ios_base::~ios_base(local_418);
      }
      uVar22 = (undefined1)uVar12;
      std::ifstream::~ifstream(local_308);
    }
    if (local_100.program != (char *)0x0) {
      operator_delete__(local_100.program);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
    if (local_4d0 != local_4c0) {
      operator_delete(local_4d0,local_4c0[0] + 1);
    }
  }
  return (bool)uVar22;
LAB_002d43d7:
  uVar12 = (ulong)uVar19;
  pbVar18 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar14 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar18 >> 5;
  uVar19 = uVar19 + 1;
  bVar4 = uVar12 < uVar14;
  unaff_R13 = pcVar20;
  pcVar11 = pcVar20;
  if (uVar14 <= uVar12) goto LAB_002d445a;
  goto LAB_002d3e5e;
}

Assistant:

bool cmFileCommand::HandleStringsCommand(std::vector<std::string> const& args)
{
  if(args.size() < 3)
    {
    this->SetError("STRINGS requires a file name and output variable");
    return false;
    }

  // Get the file to read.
  std::string fileName = args[1];
  if(!cmsys::SystemTools::FileIsFullPath(fileName.c_str()))
    {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + args[1];
    }

  // Get the variable in which to store the results.
  std::string outVar = args[2];

  // Parse the options.
  enum { arg_none,
         arg_limit_input,
         arg_limit_output,
         arg_limit_count,
         arg_length_minimum,
         arg_length_maximum,
         arg__maximum,
         arg_regex,
         arg_encoding };
  unsigned int minlen = 0;
  unsigned int maxlen = 0;
  int limit_input = -1;
  int limit_output = -1;
  unsigned int limit_count = 0;
  cmsys::RegularExpression regex;
  bool have_regex = false;
  bool newline_consume = false;
  bool hex_conversion_enabled = true;
  enum { encoding_none = cmsys::FStream::BOM_None,
         encoding_utf8 = cmsys::FStream::BOM_UTF8,
         encoding_utf16le = cmsys::FStream::BOM_UTF16LE,
         encoding_utf16be = cmsys::FStream::BOM_UTF16BE,
         encoding_utf32le = cmsys::FStream::BOM_UTF32LE,
         encoding_utf32be = cmsys::FStream::BOM_UTF32BE};
  int encoding = encoding_none;
  int arg_mode = arg_none;
  for(unsigned int i=3; i < args.size(); ++i)
    {
    if(args[i] == "LIMIT_INPUT")
      {
      arg_mode = arg_limit_input;
      }
    else if(args[i] == "LIMIT_OUTPUT")
      {
      arg_mode = arg_limit_output;
      }
    else if(args[i] == "LIMIT_COUNT")
      {
      arg_mode = arg_limit_count;
      }
    else if(args[i] == "LENGTH_MINIMUM")
      {
      arg_mode = arg_length_minimum;
      }
    else if(args[i] == "LENGTH_MAXIMUM")
      {
      arg_mode = arg_length_maximum;
      }
    else if(args[i] == "REGEX")
      {
      arg_mode = arg_regex;
      }
    else if(args[i] == "NEWLINE_CONSUME")
      {
      newline_consume = true;
      arg_mode = arg_none;
      }
    else if(args[i] == "NO_HEX_CONVERSION")
      {
      hex_conversion_enabled = false;
      arg_mode = arg_none;
      }
    else if(args[i] == "ENCODING")
      {
      arg_mode = arg_encoding;
      }
    else if(arg_mode == arg_limit_input)
      {
      if(sscanf(args[i].c_str(), "%d", &limit_input) != 1 ||
         limit_input < 0)
        {
        std::ostringstream e;
        e << "STRINGS option LIMIT_INPUT value \""
          << args[i] << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
        }
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_limit_output)
      {
      if(sscanf(args[i].c_str(), "%d", &limit_output) != 1 ||
         limit_output < 0)
        {
        std::ostringstream e;
        e << "STRINGS option LIMIT_OUTPUT value \""
          << args[i] << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
        }
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_limit_count)
      {
      int count;
      if(sscanf(args[i].c_str(), "%d", &count) != 1 || count < 0)
        {
        std::ostringstream e;
        e << "STRINGS option LIMIT_COUNT value \""
          << args[i] << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
        }
      limit_count = count;
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_length_minimum)
      {
      int len;
      if(sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0)
        {
        std::ostringstream e;
        e << "STRINGS option LENGTH_MINIMUM value \""
          << args[i] << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
        }
      minlen = len;
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_length_maximum)
      {
      int len;
      if(sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0)
        {
        std::ostringstream e;
        e << "STRINGS option LENGTH_MAXIMUM value \""
          << args[i] << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
        }
      maxlen = len;
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_regex)
      {
      if(!regex.compile(args[i].c_str()))
        {
        std::ostringstream e;
        e << "STRINGS option REGEX value \""
          << args[i] << "\" could not be compiled.";
        this->SetError(e.str());
        return false;
        }
      have_regex = true;
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_encoding)
      {
      if(args[i] == "UTF-8")
        {
        encoding = encoding_utf8;
        }
      else if(args[i] == "UTF-16LE")
        {
        encoding = encoding_utf16le;
        }
      else if(args[i] == "UTF-16BE")
        {
        encoding = encoding_utf16be;
        }
      else if(args[i] == "UTF-32LE")
        {
        encoding = encoding_utf32le;
        }
      else if(args[i] == "UTF-32BE")
        {
        encoding = encoding_utf32be;
        }
      else
        {
        std::ostringstream e;
        e << "STRINGS option ENCODING \""
          << args[i] << "\" not recognized.";
        this->SetError(e.str());
        return false;
        }
      arg_mode = arg_none;
      }
    else
      {
      std::ostringstream e;
      e << "STRINGS given unknown argument \""
        << args[i] << "\"";
      this->SetError(e.str());
      return false;
      }
    }

  if (hex_conversion_enabled)
    {
    // TODO: should work without temp file, but just on a memory buffer
    std::string binaryFileName = this->Makefile->GetCurrentBinaryDirectory();
    binaryFileName += cmake::GetCMakeFilesDirectory();
    binaryFileName += "/FileCommandStringsBinaryFile";
    if(cmHexFileConverter::TryConvert(fileName.c_str(),binaryFileName.c_str()))
      {
      fileName = binaryFileName;
      }
    }

  // Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(fileName.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(fileName.c_str(), std::ios::in);
#endif
  if(!fin)
    {
    std::ostringstream e;
    e << "STRINGS file \"" << fileName << "\" cannot be read.";
    this->SetError(e.str());
    return false;
    }

  //If BOM is found and encoding was not specified, use the BOM
  int bom_found = cmsys::FStream::ReadBOM(fin);
  if(encoding == encoding_none && bom_found != cmsys::FStream::BOM_None)
    {
    encoding = bom_found;
    }

  unsigned int bytes_rem = 0;
  if(encoding == encoding_utf16le || encoding == encoding_utf16be)
    {
    bytes_rem = 1;
    }
  if(encoding == encoding_utf32le || encoding == encoding_utf32be)
    {
    bytes_rem = 3;
    }

  // Parse strings out of the file.
  int output_size = 0;
  std::vector<std::string> strings;
  std::string s;
  while((!limit_count || strings.size() < limit_count) &&
        (limit_input < 0 || static_cast<int>(fin.tellg()) < limit_input) &&
        fin)
    {
    std::string current_str;

    int c = fin.get();
    for(unsigned int i=0; i<bytes_rem; ++i)
      {
      int c1 = fin.get();
      if(!fin)
        {
        fin.putback(static_cast<char>(c1));
        break;
        }
      c = (c << 8) | c1;
      }
    if(encoding == encoding_utf16le)
      {
      c = ((c & 0xFF) << 8) | ((c & 0xFF00) >> 8);
      }
    else if(encoding == encoding_utf32le)
      {
       c = (((c & 0xFF) << 24) | ((c & 0xFF00) << 8) |
          ((c & 0xFF0000) >> 8) | ((c & 0xFF000000) >> 24));
      }

    if(c == '\r')
      {
      // Ignore CR character to make output always have UNIX newlines.
      continue;
      }
    
    // TODO: JS - Added isprint(c) to conditions to accomodate z/OS
    //       although this should generally be the solution
    else if(isprint(c) || (c >= 0x20 && c < 0x7F) || c == '\t' ||
            (c == '\n' && newline_consume))
      {
      // This is an ASCII character that may be part of a string.
      // Cast added to avoid compiler warning. Cast is ok because
      // c is guaranteed to fit in char by the above if...
      current_str += static_cast<char>(c);
      }
    else if(encoding == encoding_utf8)
      {
      // Check for UTF-8 encoded string (up to 4 octets)
      static const unsigned char utf8_check_table[3][2] =
        {
          {0xE0, 0xC0},
          {0xF0, 0xE0},
          {0xF8, 0xF0},
        };

      // how many octets are there?
      unsigned int num_utf8_bytes = 0;
      for(unsigned int j=0; num_utf8_bytes == 0 && j<3; j++)
        {
        if((c & utf8_check_table[j][0]) == utf8_check_table[j][1])
          num_utf8_bytes = j+2;
        }

      // get subsequent octets and check that they are valid
      for(unsigned int j=0; j<num_utf8_bytes; j++)
        {
        if(j != 0)
          {
          c = fin.get();
          if(!fin || (c & 0xC0) != 0x80)
            {
            fin.putback(static_cast<char>(c));
            break;
            }
          }
        current_str += static_cast<char>(c);
        }

      // if this was an invalid utf8 sequence, discard the data, and put
      // back subsequent characters
      if((current_str.length() != num_utf8_bytes))
        {
        for(unsigned int j=0; j<current_str.size()-1; j++)
          {
          c = current_str[current_str.size() - 1 - j];
          fin.putback(static_cast<char>(c));
          }
        current_str = "";
        }
      }


    if(c == '\n' && !newline_consume)
      {
      // The current line has been terminated.  Check if the current
      // string matches the requirements.  The length may now be as
      // low as zero since blank lines are allowed.
      if(s.length() >= minlen &&
         (!have_regex || regex.find(s.c_str())))
        {
        output_size += static_cast<int>(s.size()) + 1;
        if(limit_output >= 0 && output_size >= limit_output)
          {
          s = "";
          break;
          }
        strings.push_back(s);
        }

      // Reset the string to empty.
      s = "";
      }
    else if(current_str.empty())
      {
      // A non-string character has been found.  Check if the current
      // string matches the requirements.  We require that the length
      // be at least one no matter what the user specified.
      if(s.length() >= minlen && !s.empty() &&
      (!have_regex || regex.find(s.c_str())))
        {
        output_size += static_cast<int>(s.size()) + 1;
        if(limit_output >= 0 && output_size >= limit_output)
          {
          s = "";
          break;
          }
        strings.push_back(s);
        }

      // Reset the string to empty.
      s = "";
      }
    else
      {
      s += current_str;
      }


    if(maxlen > 0 && s.size() == maxlen)
      {
      // Terminate a string if the maximum length is reached.
      if(s.length() >= minlen &&
         (!have_regex || regex.find(s.c_str())))
        {
        output_size += static_cast<int>(s.size()) + 1;
        if(limit_output >= 0 && output_size >= limit_output)
          {
          s = "";
          break;
          }
        strings.push_back(s);
        }
      s = "";
      }
    }

  // If there is a non-empty current string we have hit the end of the
  // input file or the input size limit.  Check if the current string
  // matches the requirements.
  if((!limit_count || strings.size() < limit_count) &&
     !s.empty() && s.length() >= minlen &&
     (!have_regex || regex.find(s.c_str())))
    {
    output_size += static_cast<int>(s.size()) + 1;
    if(limit_output < 0 || output_size < limit_output)
      {
      strings.push_back(s);
      }
    }

  // Encode the result in a CMake list.
  const char* sep = "";
  std::string output;
  for(std::vector<std::string>::const_iterator si = strings.begin();
      si != strings.end(); ++si)
    {
    // Separate the strings in the output to make it a list.
    output += sep;
    sep = ";";

    // Store the string in the output, but escape semicolons to
    // make sure it is a list.
    std::string const& sr = *si;
    for(unsigned int i=0; i < sr.size(); ++i)
      {
      if(sr[i] == ';')
        {
        output += '\\';
        }
      output += sr[i];
      }
    }

  // Save the output in a makefile variable.
  this->Makefile->AddDefinition(outVar, output.c_str());
  return true;
}